

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O0

oonf_telnet_result
oonf_viewer_telnet_handler
          (autobuf *out,abuf_template_storage *storage,char *cmd,char *param,
          oonf_viewer_template *templates,size_t count)

{
  int iVar1;
  int result;
  size_t count_local;
  oonf_viewer_template *templates_local;
  char *param_local;
  char *cmd_local;
  abuf_template_storage *storage_local;
  autobuf *out_local;
  
  if ((param == (char *)0x0) || (*param == '\0')) {
    abuf_appendf(out,"Error, \'%s\' command needs a parameter\n",cmd);
  }
  iVar1 = oonf_viewer_call_subcommands(out,storage,param,templates,count);
  if (iVar1 == 0) {
    out_local._4_4_ = TELNET_RESULT_ACTIVE;
  }
  else if (iVar1 < 0) {
    out_local._4_4_ = TELNET_RESULT_INTERNAL_ERROR;
  }
  else {
    abuf_appendf(out,"Unknown parameter for command \'%s\': %s\n",cmd,param);
    out_local._4_4_ = TELNET_RESULT_ACTIVE;
  }
  return out_local._4_4_;
}

Assistant:

enum oonf_telnet_result
oonf_viewer_telnet_handler(struct autobuf *out, struct abuf_template_storage *storage, const char *cmd,
  const char *param, struct oonf_viewer_template *templates, size_t count)
{
  int result;

  /* sanity check */
  if (param == NULL || *param == 0) {
    abuf_appendf(out, "Error, '%s' command needs a parameter\n", cmd);
  }

  /* call template based subcommands */
  result = oonf_viewer_call_subcommands(out, storage, param, templates, count);
  if (result == 0) {
    return TELNET_RESULT_ACTIVE;
  }
  if (result < 0) {
    return TELNET_RESULT_INTERNAL_ERROR;
  }

  abuf_appendf(out, "Unknown parameter for command '%s': %s\n", cmd, param);
  return TELNET_RESULT_ACTIVE;
}